

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O2

void __thiscall xmrig::SelfSelectClient::setState(SelfSelectClient *this,State state)

{
  uint64_t uVar1;
  long lVar2;
  
  if (this->m_state != state) {
    if (state == RetryState) {
      uVar1 = Chrono::steadyMSecs();
      this->m_timestamp = uVar1;
      lVar2 = this->m_failures;
      if (this->m_retries < lVar2) {
        (*this->m_listener->_vptr_IClientListener[2])(this->m_listener,this);
        lVar2 = this->m_failures;
      }
      this->m_failures = lVar2 + 1;
    }
    else if (state == WaitState) {
      uVar1 = Chrono::steadyMSecs();
      this->m_timestamp = uVar1;
    }
    else if (state == IdleState) {
      this->m_timestamp = 0;
      this->m_failures = 0;
    }
    this->m_state = state;
  }
  return;
}

Assistant:

void xmrig::SelfSelectClient::setState(State state)
{
    if (m_state == state) {
        return;
    }

    switch (state) {
    case IdleState:
        m_timestamp = 0;
        m_failures  = 0;
        break;

    case WaitState:
        m_timestamp = Chrono::steadyMSecs();
        break;

    case RetryState:
        m_timestamp = Chrono::steadyMSecs();

        if (m_failures > m_retries) {
            m_listener->onClose(this, static_cast<int>(m_failures));
        }

        m_failures++;
        break;
    }

    m_state = state;
}